

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O0

void __thiscall
Js::InterpreterStackFrame::
OP_GetSuperProperty<Js::OpLayoutT_ElementC2<Js::LayoutSizePolicy<(Js::LayoutSize)2>>const__unaligned>
          (InterpreterStackFrame *this,
          OpLayoutT_ElementC2<Js::LayoutSizePolicy<(Js::LayoutSize)2>_> *playout)

{
  uint localRegisterID;
  InlineCacheIndex inlineCacheIndex;
  undefined8 instance_00;
  bool bVar1;
  PropertyId PVar2;
  Var pvVar3;
  Var pvVar4;
  InlineCache *pIVar5;
  RecyclableObject *object;
  ScriptContext *requestContext;
  FunctionBody *pFVar6;
  Var local_90;
  Var value;
  PropertyValueInfo info;
  RecyclableObject *thisObj;
  RecyclableObject *superObj;
  PropertyId propertyId;
  InlineCache *inlineCache;
  Var thisInstance;
  Var instance;
  OpLayoutT_ElementC2<Js::LayoutSizePolicy<(Js::LayoutSize)2>_> *playout_local;
  InterpreterStackFrame *this_local;
  
  pvVar3 = GetReg<unsigned_int>(this,playout->Instance);
  pvVar4 = GetReg<unsigned_int>(this,playout->Value2);
  pIVar5 = GetInlineCache(this,playout->PropertyIdIndex);
  PVar2 = GetPropertyIdFromCacheId(this,playout->PropertyIdIndex);
  bVar1 = VarIs<Js::RecyclableObject>(pvVar3);
  if ((bVar1) && (bVar1 = VarIs<Js::RecyclableObject>(pvVar4), bVar1)) {
    object = VarTo<Js::RecyclableObject>(pvVar3);
    info._56_8_ = VarTo<Js::RecyclableObject>(pvVar4);
    PropertyValueInfo::PropertyValueInfo((PropertyValueInfo *)&value);
    pFVar6 = GetFunctionBody(this);
    PropertyValueInfo::SetCacheInfo
              ((PropertyValueInfo *)&value,pFVar6,pIVar5,playout->PropertyIdIndex,true);
    instance_00 = info._56_8_;
    requestContext = GetScriptContext(this);
    bVar1 = CacheOperators::
            TryGetProperty<true,false,false,false,false,false,true,false,false,false>
                      ((Var)instance_00,false,object,PVar2,&local_90,requestContext,
                       (PropertyCacheOperationInfo *)0x0,(PropertyValueInfo *)&value);
    if (bVar1) {
      SetReg<unsigned_int>(this,playout->Value,local_90);
      return;
    }
  }
  localRegisterID = playout->Value;
  pFVar6 = GetFunctionBody(this);
  pIVar5 = GetInlineCache(this,playout->PropertyIdIndex);
  inlineCacheIndex = playout->PropertyIdIndex;
  pvVar3 = GetReg<unsigned_int>(this,playout->Instance);
  PVar2 = GetPropertyIdFromCacheId(this,playout->PropertyIdIndex);
  pvVar4 = GetReg<unsigned_int>(this,playout->Value2);
  pvVar3 = Js::JavascriptOperators::PatchGetValueWithThisPtr<false,Js::InlineCache>
                     (pFVar6,pIVar5,inlineCacheIndex,pvVar3,PVar2,pvVar4);
  SetReg<unsigned_int>(this,localRegisterID,pvVar3);
  return;
}

Assistant:

void InterpreterStackFrame::OP_GetSuperProperty(unaligned T* playout)
    {
        // Same fast path as in the backend.
        Var instance = GetReg(playout->Instance);
        Var thisInstance = GetReg(playout->Value2);
        InlineCache *inlineCache = GetInlineCache(playout->PropertyIdIndex);
        PropertyId propertyId = GetPropertyIdFromCacheId(playout->PropertyIdIndex);
        if (VarIs<RecyclableObject>(instance) && VarIs<RecyclableObject>(thisInstance))
        {
            RecyclableObject* superObj = VarTo<RecyclableObject>(instance);
            RecyclableObject* thisObj = VarTo<RecyclableObject>(thisInstance);
            PropertyValueInfo info;
            PropertyValueInfo::SetCacheInfo(&info, GetFunctionBody(), inlineCache, playout->PropertyIdIndex, true);

            Var value;
            if (CacheOperators::TryGetProperty<true, false, false, false, false, false, true, false, false, false>(
                thisObj, false, superObj, propertyId, &value, GetScriptContext(), nullptr, &info))
            {
                SetReg(playout->Value, value);
                return;
            }
        }
        SetReg(
            playout->Value,
            JavascriptOperators::PatchGetValueWithThisPtr<false>(
                GetFunctionBody(),
                GetInlineCache(playout->PropertyIdIndex),
                playout->PropertyIdIndex,
                GetReg(playout->Instance),
                GetPropertyIdFromCacheId(playout->PropertyIdIndex),
                GetReg(playout->Value2)));
    }